

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

Ptr __thiscall
core::image::create_for_type(image *this,ImageType type,int width,int height,int channels)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Ptr PVar2;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [32];
  int local_20;
  int local_1c;
  int channels_local;
  int height_local;
  int width_local;
  ImageType type_local;
  
  local_20 = channels;
  local_1c = height;
  channels_local = width;
  height_local = type;
  _width_local = this;
  if (type - IMAGE_TYPE_UINT8 < 9 || type == IMAGE_TYPE_DOUBLE) {
    switch((long)&switchD_0012fee9::switchdataD_001555cc +
           (long)(int)(&switchD_0012fee9::switchdataD_001555cc)[type - IMAGE_TYPE_UINT8]) {
    case 0x12feeb:
      Image<unsigned_char>::create((Image<unsigned_char> *)(local_40 + 0x10),width,height,channels);
      std::shared_ptr<core::ImageBase>::shared_ptr<core::Image<unsigned_char>,void>
                ((shared_ptr<core::ImageBase> *)this,
                 (shared_ptr<core::Image<unsigned_char>_> *)(local_40 + 0x10));
      std::shared_ptr<core::Image<unsigned_char>_>::~shared_ptr
                ((shared_ptr<core::Image<unsigned_char>_> *)(local_40 + 0x10));
      _Var1._M_pi = extraout_RDX;
      break;
    case 0x12ff1b:
      Image<unsigned_short>::create((Image<unsigned_short> *)local_40,width,height,channels);
      std::shared_ptr<core::ImageBase>::shared_ptr<core::Image<unsigned_short>,void>
                ((shared_ptr<core::ImageBase> *)this,
                 (shared_ptr<core::Image<unsigned_short>_> *)local_40);
      std::shared_ptr<core::Image<unsigned_short>_>::~shared_ptr
                ((shared_ptr<core::Image<unsigned_short>_> *)local_40);
      _Var1._M_pi = extraout_RDX_00;
      break;
    case 0x12ff4b:
      Image<unsigned_int>::create((Image<unsigned_int> *)local_50,width,height,channels);
      std::shared_ptr<core::ImageBase>::shared_ptr<core::Image<unsigned_int>,void>
                ((shared_ptr<core::ImageBase> *)this,
                 (shared_ptr<core::Image<unsigned_int>_> *)local_50);
      std::shared_ptr<core::Image<unsigned_int>_>::~shared_ptr
                ((shared_ptr<core::Image<unsigned_int>_> *)local_50);
      _Var1._M_pi = extraout_RDX_01;
      break;
    case 0x12ff7b:
      Image<unsigned_long>::create((Image<unsigned_long> *)local_60,width,height,channels);
      std::shared_ptr<core::ImageBase>::shared_ptr<core::Image<unsigned_long>,void>
                ((shared_ptr<core::ImageBase> *)this,
                 (shared_ptr<core::Image<unsigned_long>_> *)local_60);
      std::shared_ptr<core::Image<unsigned_long>_>::~shared_ptr
                ((shared_ptr<core::Image<unsigned_long>_> *)local_60);
      _Var1._M_pi = extraout_RDX_02;
      break;
    case 0x12ffab:
      Image<signed_char>::create((Image<signed_char> *)local_70,width,height,channels);
      std::shared_ptr<core::ImageBase>::shared_ptr<core::Image<signed_char>,void>
                ((shared_ptr<core::ImageBase> *)this,
                 (shared_ptr<core::Image<signed_char>_> *)local_70);
      std::shared_ptr<core::Image<signed_char>_>::~shared_ptr
                ((shared_ptr<core::Image<signed_char>_> *)local_70);
      _Var1._M_pi = extraout_RDX_03;
      break;
    case 0x12ffdb:
      Image<short>::create((Image<short> *)local_80,width,height,channels);
      std::shared_ptr<core::ImageBase>::shared_ptr<core::Image<short>,void>
                ((shared_ptr<core::ImageBase> *)this,(shared_ptr<core::Image<short>_> *)local_80);
      std::shared_ptr<core::Image<short>_>::~shared_ptr((shared_ptr<core::Image<short>_> *)local_80)
      ;
      _Var1._M_pi = extraout_RDX_04;
      break;
    case 0x13000b:
      Image<int>::create((Image<int> *)local_90,width,height,channels);
      std::shared_ptr<core::ImageBase>::shared_ptr<core::Image<int>,void>
                ((shared_ptr<core::ImageBase> *)this,(shared_ptr<core::Image<int>_> *)local_90);
      std::shared_ptr<core::Image<int>_>::~shared_ptr((shared_ptr<core::Image<int>_> *)local_90);
      _Var1._M_pi = extraout_RDX_05;
      break;
    case 0x130044:
      Image<long>::create((Image<long> *)local_a0,width,height,channels);
      std::shared_ptr<core::ImageBase>::shared_ptr<core::Image<long>,void>
                ((shared_ptr<core::ImageBase> *)this,(shared_ptr<core::Image<long>_> *)local_a0);
      std::shared_ptr<core::Image<long>_>::~shared_ptr((shared_ptr<core::Image<long>_> *)local_a0);
      _Var1._M_pi = extraout_RDX_06;
      break;
    case 0x13007a:
      Image<float>::create((Image<float> *)local_b0,width,height,channels);
      std::shared_ptr<core::ImageBase>::shared_ptr<core::Image<float>,void>
                ((shared_ptr<core::ImageBase> *)this,(shared_ptr<core::Image<float>_> *)local_b0);
      std::shared_ptr<core::Image<float>_>::~shared_ptr((shared_ptr<core::Image<float>_> *)local_b0)
      ;
      _Var1._M_pi = extraout_RDX_07;
      break;
    case 0x1300b0:
      Image<double>::create((Image<double> *)local_c0,width,height,channels);
      std::shared_ptr<core::ImageBase>::shared_ptr<core::Image<double>,void>
                ((shared_ptr<core::ImageBase> *)this,(shared_ptr<core::Image<double>_> *)local_c0);
      std::shared_ptr<core::Image<double>_>::~shared_ptr
                ((shared_ptr<core::Image<double>_> *)local_c0);
      _Var1._M_pi = extraout_RDX_08;
    }
  }
  else {
    std::shared_ptr<core::ImageBase>::shared_ptr((shared_ptr<core::ImageBase> *)this,(nullptr_t)0x0)
    ;
    _Var1._M_pi = extraout_RDX_09;
  }
  PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar2.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline ImageBase::Ptr
create_for_type (ImageType type, int width, int height, int channels)
{
    switch (type)
    {
        case IMAGE_TYPE_UINT8:
            return Image<uint8_t>::create(width, height, channels);
        case IMAGE_TYPE_UINT16:
            return Image<uint16_t>::create(width, height, channels);
        case IMAGE_TYPE_UINT32:
            return Image<uint32_t>::create(width, height, channels);
        case IMAGE_TYPE_UINT64:
            return Image<uint64_t>::create(width, height, channels);
        case IMAGE_TYPE_SINT8:
            return Image<int8_t>::create(width, height, channels);
        case IMAGE_TYPE_SINT16:
            return Image<int16_t>::create(width, height, channels);
        case IMAGE_TYPE_SINT32:
            return Image<int32_t>::create(width, height, channels);
        case IMAGE_TYPE_SINT64:
            return Image<int64_t>::create(width, height, channels);
        case IMAGE_TYPE_FLOAT:
            return Image<float>::create(width, height, channels);
        case IMAGE_TYPE_DOUBLE:
            return Image<double>::create(width, height, channels);
        default:
            break;
    }

    return ImageBase::Ptr(nullptr);
}